

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

bool __thiscall
rapidjson::internal::BigInteger::Difference(BigInteger *this,BigInteger *rhs,BigInteger *out)

{
  int iVar1;
  RapidJSONException *this_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  BigInteger *pBVar5;
  
  iVar1 = Compare(this,rhs);
  if (iVar1 == 0) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: cmp != 0");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar5 = rhs;
  if (iVar1 < 0) {
    pBVar5 = this;
    this = rhs;
  }
  lVar2 = 0;
  uVar4 = 0;
  while (uVar4 < this->count_) {
    uVar3 = lVar2 + this->digits_[uVar4];
    if (uVar4 < pBVar5->count_) {
      uVar3 = uVar3 - pBVar5->digits_[uVar4];
    }
    lVar2 = -(ulong)(this->digits_[uVar4] < uVar3);
    out->digits_[uVar4] = uVar3;
    uVar4 = uVar4 + 1;
    if (uVar3 != 0) {
      out->count_ = uVar4;
    }
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool Difference(const BigInteger& rhs, BigInteger* out) const {
        int cmp = Compare(rhs);
        CEREAL_RAPIDJSON_ASSERT(cmp != 0);
        const BigInteger *a, *b;  // Makes a > b
        bool ret;
        if (cmp < 0) { a = &rhs; b = this; ret = true; }
        else         { a = this; b = &rhs; ret = false; }

        Type borrow = 0;
        for (size_t i = 0; i < a->count_; i++) {
            Type d = a->digits_[i] - borrow;
            if (i < b->count_)
                d -= b->digits_[i];
            borrow = (d > a->digits_[i]) ? 1 : 0;
            out->digits_[i] = d;
            if (d != 0)
                out->count_ = i + 1;
        }

        return ret;
    }